

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::strcpy_insitu_allow<unsigned_long>
               (size_t length,unsigned_long *header,uintptr_t header_mask,char_t *target)

{
  size_t sVar1;
  ulong in_RDX;
  ulong *in_RSI;
  ulong in_RDI;
  size_t reuse_threshold;
  size_t target_length;
  bool local_3a;
  bool local_39;
  bool local_1;
  
  if ((*in_RSI & 0x40) == 0) {
    sVar1 = strlength((char_t *)0x1473fe);
    if ((*in_RSI & in_RDX) == 0) {
      local_1 = in_RDI <= sVar1;
    }
    else {
      local_39 = false;
      if (in_RDI <= sVar1) {
        local_3a = sVar1 < 0x20 || sVar1 - in_RDI < sVar1 >> 1;
        local_39 = local_3a;
      }
      local_1 = local_39;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool strcpy_insitu_allow(size_t length, const Header& header, uintptr_t header_mask, char_t* target)
	{
		// never reuse shared memory
		if (header & xml_memory_page_contents_shared_mask) return false;

		size_t target_length = strlength(target);

		// always reuse document buffer memory if possible
		if ((header & header_mask) == 0) return target_length >= length;

		// reuse heap memory if waste is not too great
		const size_t reuse_threshold = 32;

		return target_length >= length && (target_length < reuse_threshold || target_length - length < target_length / 2);
	}